

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

QRgbaFloat32 *
qt_fetch_radial_gradient_rgbfp
          (QRgbaFloat32 *buffer,Operator *op,QSpanData *data,int y,int x,int length)

{
  QRgbaFloat<float> *pQVar1;
  int in_stack_00000104;
  int in_stack_00000108;
  int in_stack_0000010c;
  QSpanData *in_stack_00000110;
  Operator *in_stack_00000118;
  QRgbaFloat<float> *in_stack_00000120;
  
  pQVar1 = qt_fetch_radial_gradient_template<RadialFetchPlain<GradientBaseFP>,QRgbaFloat<float>>
                     (in_stack_00000120,in_stack_00000118,in_stack_00000110,in_stack_0000010c,
                      in_stack_00000108,in_stack_00000104);
  return pQVar1;
}

Assistant:

static const QRgbaFloat32 * QT_FASTCALL qt_fetch_radial_gradient_rgbfp(QRgbaFloat32 *buffer, const Operator *op, const QSpanData *data,
                                                                   int y, int x, int length)
{
    return qt_fetch_radial_gradient_template<RadialFetchPlain<GradientBaseFP>, QRgbaFloat32>(buffer, op, data, y, x, length);
}